

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall thread_pool::wait_all(thread_pool *this)

{
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  thread_pool *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->m_mutex);
  std::condition_variable::wait<thread_pool::wait_all()::_lambda()_1_>
            (&this->m_cvWait,(unique_lock<std::mutex> *)local_20,(anon_class_8_1_8991fb9c)this);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void wait_all() {
    std::unique_lock<std::mutex> lock(m_mutex);
    m_cvWait.wait(lock, [this]() -> bool {
                          return
                            !m_running ||
                            (m_work.empty() && m_doingWork == 0);
                        });
  }